

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReaderInternal<true>
          (duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  PhysicalType PVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  PVar1 = (schema->type).physical_type_;
  switch(PVar1) {
  case INT16:
    make_uniq<duckdb::DecimalColumnReader<short,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
    break;
  case UINT32:
  case UINT64:
  case UINT64|UINT8:
  case FLOAT:
switchD_01de2e53_caseD_6:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Unrecognized type for Decimal",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case INT32:
    make_uniq<duckdb::DecimalColumnReader<int,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
    break;
  case INT64:
    make_uniq<duckdb::DecimalColumnReader<long,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
    break;
  case DOUBLE:
    make_uniq<duckdb::DecimalColumnReader<double,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
    break;
  default:
    if (PVar1 != INT128) goto switchD_01de2e53_caseD_6;
    make_uniq<duckdb::DecimalColumnReader<duckdb::hugeint_t,true>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)&local_38,reader,schema);
  }
  *(pointer *)this = local_38._M_dataplus._M_p;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReaderInternal(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<DecimalColumnReader<int16_t, FIXED>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<DecimalColumnReader<int32_t, FIXED>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<DecimalColumnReader<int64_t, FIXED>>(reader, schema);
	case PhysicalType::INT128:
		return make_uniq<DecimalColumnReader<hugeint_t, FIXED>>(reader, schema);
	case PhysicalType::DOUBLE:
		return make_uniq<DecimalColumnReader<double, FIXED>>(reader, schema);
	default:
		throw InternalException("Unrecognized type for Decimal");
	}
}